

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O0

void __thiscall sf::priv::WindowImplX11::setProtocols(WindowImplX11 *this)

{
  undefined8 uVar1;
  bool bVar2;
  __pid_t _Var3;
  Atom AVar4;
  ostream *poVar5;
  reference pvVar6;
  size_type sVar7;
  long in_RDI;
  long pid;
  Atom netWmPid;
  Atom netWmPing;
  vector<unsigned_long,_std::allocator<unsigned_long>_> atoms;
  Atom wmDeleteWindow;
  Atom wmProtocols;
  value_type_conflict3 *in_stack_fffffffffffffe68;
  ostream *in_stack_fffffffffffffe70;
  undefined8 in_stack_fffffffffffffe90;
  undefined1 onlyIfExists;
  undefined8 uVar8;
  string *in_stack_fffffffffffffe98;
  long local_f8;
  allocator local_e9;
  string local_e8 [39];
  allocator local_c1;
  string local_c0 [32];
  Atom local_a0;
  Atom local_98;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_90;
  allocator local_71;
  string local_70 [32];
  Atom local_50;
  allocator local_31;
  string local_30 [32];
  Atom local_10;
  
  onlyIfExists = (undefined1)((ulong)in_stack_fffffffffffffe90 >> 0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"WM_PROTOCOLS",&local_31);
  AVar4 = getAtom(in_stack_fffffffffffffe98,(bool)onlyIfExists);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  local_10 = AVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"WM_DELETE_WINDOW",&local_71);
  AVar4 = getAtom(in_stack_fffffffffffffe98,(bool)onlyIfExists);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  local_50 = AVar4;
  if (local_10 == 0) {
    poVar5 = err();
    poVar5 = std::operator<<(poVar5,"Failed to request WM_PROTOCOLS atom.");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  else {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x264a91);
    if (local_50 == 0) {
      poVar5 = err();
      poVar5 = std::operator<<(poVar5,"Failed to request WM_DELETE_WINDOW atom.");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
    else {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe70,
                 in_stack_fffffffffffffe68);
    }
    local_98 = 0;
    local_a0 = 0;
    bVar2 = anon_unknown.dwarf_23372c::WindowsImplX11Impl::ewmhSupported();
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c0,"_NET_WM_PING",&local_c1);
      local_98 = getAtom(in_stack_fffffffffffffe98,(bool)onlyIfExists);
      std::__cxx11::string::~string(local_c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_c1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e8,"_NET_WM_PID",&local_e9);
      local_a0 = getAtom(in_stack_fffffffffffffe98,(bool)onlyIfExists);
      std::__cxx11::string::~string(local_e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_e9);
    }
    if ((local_98 != 0) && (local_a0 != 0)) {
      _Var3 = getpid();
      local_f8 = (long)_Var3;
      XChangeProperty(*(undefined8 *)(in_RDI + 0x3d0),*(undefined8 *)(in_RDI + 0x3c8),local_a0,6,
                      0x20,0,&local_f8,1);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe70,
                 in_stack_fffffffffffffe68);
    }
    bVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       in_stack_fffffffffffffe70);
    if (bVar2) {
      in_stack_fffffffffffffe70 = err();
      poVar5 = std::operator<<(in_stack_fffffffffffffe70,"Didn\'t set any window protocols");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
    else {
      uVar8 = *(undefined8 *)(in_RDI + 0x3c8);
      uVar1 = *(undefined8 *)(in_RDI + 0x3d0);
      AVar4 = local_10;
      pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](&local_90,0);
      sVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_90);
      XChangeProperty(uVar1,uVar8,AVar4,4,0x20,0,pvVar6,(int)sVar7);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe70);
  }
  return;
}

Assistant:

void WindowImplX11::setProtocols()
{
    using namespace WindowsImplX11Impl;

    Atom wmProtocols = getAtom("WM_PROTOCOLS");
    Atom wmDeleteWindow = getAtom("WM_DELETE_WINDOW");

    if (!wmProtocols)
    {
        err() << "Failed to request WM_PROTOCOLS atom." << std::endl;
        return;
    }

    std::vector<Atom> atoms;

    if (wmDeleteWindow)
    {
        atoms.push_back(wmDeleteWindow);
    }
    else
    {
        err() << "Failed to request WM_DELETE_WINDOW atom." << std::endl;
    }

    Atom netWmPing = None;
    Atom netWmPid = None;

    if (ewmhSupported())
    {
        netWmPing = getAtom("_NET_WM_PING", true);
        netWmPid = getAtom("_NET_WM_PID", true);
    }

    if (netWmPing && netWmPid)
    {
        const long pid = getpid();

        XChangeProperty(m_display,
                        m_window,
                        netWmPid,
                        XA_CARDINAL,
                        32,
                        PropModeReplace,
                        reinterpret_cast<const unsigned char*>(&pid),
                        1);

        atoms.push_back(netWmPing);
    }

    if (!atoms.empty())
    {
        XChangeProperty(m_display,
                        m_window,
                        wmProtocols,
                        XA_ATOM,
                        32,
                        PropModeReplace,
                        reinterpret_cast<const unsigned char*>(&atoms[0]),
                        static_cast<int>(atoms.size()));
    }
    else
    {
        err() << "Didn't set any window protocols" << std::endl;
    }
}